

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.cpp
# Opt level: O0

ConsoleCommand * getConsoleCommand(string_view trigger)

{
  bool bVar1;
  reference ppCVar2;
  ulong uVar3;
  ConsoleCommand **command;
  iterator __end1;
  iterator __begin1;
  vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_> *__range1;
  string_view trigger_local;
  
  __end1 = std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>::begin
                     (&g_consoleCommands);
  command = (ConsoleCommand **)
            std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>::end
                      (&g_consoleCommands);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ConsoleCommand_**,_std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>_>
                      (&__end1,(__normal_iterator<ConsoleCommand_**,_std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>_>
                                *)&command);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (ConsoleCommand *)0x0;
    }
    ppCVar2 = __gnu_cxx::
              __normal_iterator<ConsoleCommand_**,_std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>_>
              ::operator*(&__end1);
    uVar3 = Jupiter::Command::matches(*ppCVar2,trigger._M_len,trigger._M_str);
    if ((uVar3 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<ConsoleCommand_**,_std::vector<ConsoleCommand_*,_std::allocator<ConsoleCommand_*>_>_>
    ::operator++(&__end1);
  }
  return *ppCVar2;
}

Assistant:

ConsoleCommand* getConsoleCommand(std::string_view trigger) {
	for (const auto& command : consoleCommands) {
		if (command->matches(trigger)) {
			return command;
		}
	}

	return nullptr;
}